

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# DictionaryEntry.h
# Opt level: O0

uint __thiscall
JsUtil::anon_unknown_5::ImplicitKeyValueEntry<unsigned_int,_Value_*>::Key
          (ImplicitKeyValueEntry<unsigned_int,_Value_*> *this)

{
  ValueNumber VVar1;
  ImplicitKeyValueEntry<unsigned_int,_Value_*> *this_local;
  
  VVar1 = ValueToKey<unsigned_int,_Value_*>::ToKey((Value **)this);
  return VVar1;
}

Assistant:

TKey Key() const { return ValueToKey<TKey, TValue>::ToKey(this->value); }